

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv_uptime(double *uptime)

{
  int *piVar1;
  int local_2c;
  undefined1 auStack_28 [4];
  int r;
  timespec now;
  double *uptime_local;
  
  now.tv_nsec = (__syscall_slong_t)uptime;
  if (uv_uptime::no_clock_boottime == 0) {
    local_2c = clock_gettime(7,(timespec *)auStack_28);
    if ((local_2c == 0) || (piVar1 = __errno_location(), *piVar1 != 0x16)) goto LAB_0078182a;
    uv_uptime::no_clock_boottime = 1;
  }
  local_2c = clock_gettime(1,(timespec *)auStack_28);
LAB_0078182a:
  if (local_2c == 0) {
    *(double *)now.tv_nsec = (double)_auStack_28;
    uptime_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    uptime_local._4_4_ = -*piVar1;
  }
  return uptime_local._4_4_;
}

Assistant:

int uv_uptime(double* uptime) {
  static volatile int no_clock_boottime;
  struct timespec now;
  int r;

  /* Try CLOCK_BOOTTIME first, fall back to CLOCK_MONOTONIC if not available
   * (pre-2.6.39 kernels). CLOCK_MONOTONIC doesn't increase when the system
   * is suspended.
   */
  if (no_clock_boottime) {
    retry: r = clock_gettime(CLOCK_MONOTONIC, &now);
  }
  else if ((r = clock_gettime(CLOCK_BOOTTIME, &now)) && errno == EINVAL) {
    no_clock_boottime = 1;
    goto retry;
  }

  if (r)
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}